

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *targetCompilePdb,string *targetPdb,string *outputConfig,
          WithScanning withScanning)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer s;
  string_view source;
  string cmdVar;
  cmRulePlaceholderExpander *local_268;
  string local_260;
  cmNinjaTargetGenerator *local_240;
  string cmdLine;
  cmList compileCmds;
  string cudaCompileMode;
  string escapedSourceFileName;
  string fullFlags;
  RuleVariables compileObjectVars;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileObjectVars,"EXPORT_COMPILE_COMMANDS",
             (allocator<char> *)&escapedSourceFileName);
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)&compileObjectVars);
  std::__cxx11::string::~string((string *)&compileObjectVars);
  if (bVar4) {
    memset(&compileObjectVars,0,0x158);
    compileObjectVars.Language = (language->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&escapedSourceFileName,(string *)sourceFileName);
    bVar4 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar4) {
      pcVar7 = GetGlobalGenerator(this);
      psVar8 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&fullFlags,&escapedSourceFileName,psVar8);
      std::__cxx11::string::operator=((string *)&escapedSourceFileName,(string *)&fullFlags);
      std::__cxx11::string::~string((string *)&fullFlags);
    }
    source._M_str = escapedSourceFileName._M_dataplus._M_p;
    source._M_len = escapedSourceFileName._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&fullFlags,(cmOutputConverter *)this->LocalGenerator,source,SHELL,false);
    std::__cxx11::string::operator=((string *)&escapedSourceFileName,(string *)&fullFlags);
    std::__cxx11::string::~string((string *)&fullFlags);
    std::__cxx11::string::string((string *)&fullFlags,(string *)flags);
    if (withScanning == Yes) {
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
                (&cudaCompileMode,(char (*) [7])0x6cf18b,language,
                 (char (*) [19])"_MODULE_MAP_FORMAT");
      psVar8 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&cudaCompileMode);
      std::__cxx11::string::string((string *)&cmdVar,(string *)psVar8);
      if (cmdVar._M_string_length != 0) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[17]>
                  (&local_260,(char (*) [7])0x6cf18b,language,(char (*) [17])"_MODULE_MAP_FLAG");
        psVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&local_260);
        std::__cxx11::string::string((string *)&cmdLine,(string *)psVar8);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"<MODULE_MAP_FILE>",(allocator<char> *)&local_268);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
                  ((string *)&compileCmds,objectFileName,(char (*) [8])".modmap");
        cmsys::SystemTools::ReplaceString(&cmdLine,&local_260,(string *)&compileCmds);
        std::__cxx11::string::~string((string *)&compileCmds);
        std::__cxx11::string::~string((string *)&local_260);
        compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(compileCmds.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        cmStrCat<char,std::__cxx11::string&>(&local_260,(char *)&compileCmds,&cmdLine);
        std::__cxx11::string::append((string *)&fullFlags);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&cmdLine);
      }
      std::__cxx11::string::~string((string *)&cmdVar);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
    }
    compileObjectVars.Source = escapedSourceFileName._M_dataplus._M_p;
    compileObjectVars.Object = (objectFileName->_M_dataplus)._M_p;
    compileObjectVars.ObjectDir = (objectDir->_M_dataplus)._M_p;
    compileObjectVars.ObjectFileDir = (objectFileDir->_M_dataplus)._M_p;
    compileObjectVars.Flags = fullFlags._M_dataplus._M_p;
    compileObjectVars.Defines = (defines->_M_dataplus)._M_p;
    compileObjectVars.Includes = (includes->_M_dataplus)._M_p;
    compileObjectVars.TargetCompilePDB = (targetCompilePdb->_M_dataplus)._M_p;
    compileObjectVars.TargetPDB = (targetPdb->_M_dataplus)._M_p;
    cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
    cudaCompileMode._M_string_length = 0;
    cudaCompileMode.field_2._M_local_buf[0] = '\0';
    bVar4 = std::operator==(language,"CUDA");
    if (bVar4) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmdVar,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&cmdLine);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&cmdVar);
      std::__cxx11::string::~string((string *)&cmdVar);
      if (bVar4) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmdVar,"_CMAKE_CUDA_RDC_FLAG",(allocator<char> *)&cmdLine);
        psVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&cmdVar);
        std::__cxx11::string::~string((string *)&cmdVar);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2]>
                  (&cmdVar,&cudaCompileMode,psVar8,(char (*) [2])0x6f1305);
        std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
        std::__cxx11::string::~string((string *)&cmdVar);
      }
      local_240 = this;
      if (ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
          ::compileModes == '\0') {
        iVar6 = __cxa_guard_acquire(&ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                                     ::compileModes);
        if (iVar6 != 0) {
          ExportObjectCompileCommand::compileModes._M_elems[0]._M_len = 3;
          ExportObjectCompileCommand::compileModes._M_elems[0]._M_str = "PTX";
          ExportObjectCompileCommand::compileModes._M_elems[1]._M_len = 5;
          ExportObjectCompileCommand::compileModes._M_elems[1]._M_str = "CUBIN";
          ExportObjectCompileCommand::compileModes._M_elems[2]._M_len = 6;
          ExportObjectCompileCommand::compileModes._M_elems[2]._M_str = "FATBIN";
          ExportObjectCompileCommand::compileModes._M_elems[3]._M_len = 5;
          ExportObjectCompileCommand::compileModes._M_elems[3]._M_str = "OPTIX";
          __cxa_guard_release(&ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                               ::compileModes);
        }
      }
      bVar4 = true;
      lVar9 = 0;
      do {
        if (lVar9 == 0x40) break;
        compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)&ExportObjectCompileCommand::compileModes._M_elems[0]._M_len + lVar9);
        compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&ExportObjectCompileCommand::compileModes._M_elems[0]._M_str + lVar9);
        cmStrCat<char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[13]>
                  (&cmdVar,(char (*) [6])0x6f32f9,
                   (basic_string_view<char,_std::char_traits<char>_> *)&compileCmds,
                   (char (*) [13])0x6d347a);
        cmStrCat<char_const(&)[13],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                  (&cmdLine,(char (*) [13])"_CMAKE_CUDA_",
                   (basic_string_view<char,_std::char_traits<char>_> *)&compileCmds,
                   (char (*) [6])0x6f32dc);
        bVar5 = cmGeneratorTarget::GetPropertyAsBool
                          ((local_240->super_cmCommonTargetGenerator).GeneratorTarget,&cmdVar);
        if (bVar5) {
          psVar8 = cmMakefile::GetRequiredDefinition
                             ((local_240->super_cmCommonTargetGenerator).Makefile,&cmdLine);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                    (&local_260,&cudaCompileMode,psVar8);
          std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          bVar4 = false;
        }
        std::__cxx11::string::~string((string *)&cmdLine);
        std::__cxx11::string::~string((string *)&cmdVar);
        lVar9 = lVar9 + 0x10;
      } while (!bVar5);
      this = local_240;
      if (bVar4) {
        pcVar2 = (local_240->super_cmCommonTargetGenerator).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmdVar,"_CMAKE_CUDA_WHOLE_FLAG",(allocator<char> *)&cmdLine);
        psVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&cmdVar);
        std::__cxx11::string::~string((string *)&cmdVar);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>(&cmdVar,&cudaCompileMode,psVar8)
        ;
        std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
        std::__cxx11::string::~string((string *)&cmdVar);
      }
      compileObjectVars.CudaCompileMode = cudaCompileMode._M_dataplus._M_p;
    }
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
              (&cmdVar,(char (*) [7])0x6cf18b,language,(char (*) [16])0x6f36b6);
    psVar8 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&cmdVar);
    cmList::cmList(&compileCmds,psVar8,Yes,No);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_268);
    pbVar3 = compileCmds.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (s = compileCmds.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; s != pbVar3; s = s + 1) {
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_268,(cmOutputConverter *)this->LocalGenerator,s,&compileObjectVars);
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&cmdLine,this->LocalGenerator,&compileCmds.Values,outputConfig,outputConfig,
               &local_260,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_260);
    pcVar7 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar7,&cmdLine,sourceFileName,objectFileName);
    std::__cxx11::string::~string((string *)&cmdLine);
    if (local_268 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_268->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&compileCmds.Values);
    std::__cxx11::string::~string((string *)&cmdVar);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&fullFlags);
    std::__cxx11::string::~string((string *)&escapedSourceFileName);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& targetCompilePdb, std::string const& targetPdb,
  std::string const& outputConfig, WithScanning withScanning)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  std::string fullFlags = flags;
  if (withScanning == WithScanning::Yes) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_", language, "_MODULE_MAP_FORMAT");
    std::string const modmapFormat =
      this->Makefile->GetSafeDefinition(modmapFormatVar);
    if (!modmapFormat.empty()) {
      std::string modmapFlags = this->GetMakefile()->GetRequiredDefinition(
        cmStrCat("CMAKE_", language, "_MODULE_MAP_FLAG"));
      // XXX(modmap): If changing this path construction, change
      // `cmGlobalNinjaGenerator::WriteDyndep` and
      // `cmNinjaTargetGenerator::WriteObjectBuildStatement` to expect the
      // corresponding file path.
      cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                   cmStrCat(objectFileName, ".modmap"));
      fullFlags += cmStrCat(' ', modmapFlags);
    }
  }

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = fullFlags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();
  compileObjectVars.TargetCompilePDB = targetCompilePdb.c_str();
  compileObjectVars.TargetPDB = targetPdb.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (auto& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}